

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O3

void wary_dog(monst *mtmp,boolean was_dead)

{
  int *piVar1;
  byte *pbVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  
  mtmp->meating = 0;
  cVar5 = mtmp->mtame;
  if ((long)cVar5 == 0) {
    return;
  }
  uVar6 = *(uint *)&mtmp->field_0x60;
  if ((uVar6 >> 0x1a & 1) == 0) {
    iVar7 = *(int *)&mtmp[1].minvent;
    if (iVar7 != 0) {
      uVar3 = mtmp->mhp;
      uVar4 = mtmp->mhpmax;
      mtmp->mhp = iVar7 + uVar3;
      mtmp->mhpmax = iVar7 + uVar4;
      *(undefined4 *)&mtmp[1].minvent = 0;
    }
    uVar9 = *(uint *)&mtmp[1].dlevel;
    if ((int)uVar9 < 3 && ((ulong)mtmp[1].minvent & 0x1000000000000) == 0) goto LAB_00173d67;
    mtmp->mtame = '\0';
    *(uint *)&mtmp->field_0x60 = uVar6 & 0xfbbfffff;
    if ((uVar9 < 10) && (uVar8 = mt_random(), uVar8 % (uVar9 + 1) == 0)) {
      mtmp->field_0x62 = mtmp->field_0x62 | 0x40;
    }
    if (((was_dead == '\0') && ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0)) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)) {
      uVar9 = mtmp->data->mflags1;
      pcVar10 = Monnam(mtmp);
      if ((uVar9 >> 0xc & 1) == 0) {
        pcVar12 = "seems unable";
        if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
          pcVar12 = "refuses";
        }
        pcVar11 = body_part(1);
        pline("%s %s to look you in the %s.",pcVar10,pcVar12,pcVar11);
      }
      else {
        pline("%s avoids your gaze.",pcVar10);
      }
    }
LAB_00173d78:
    if (mtmp->mtame != '\0') goto LAB_00173da8;
  }
  else {
LAB_00173d67:
    uVar9 = mt_random();
    if (SUB168(ZEXT416(uVar9) % SEXT816((long)cVar5),0) != 0) goto LAB_00173d78;
    mtmp->mtame = '\0';
    mtmp->field_0x62 = mtmp->field_0x62 & 0xbf;
  }
  newsym((int)mtmp->mx,(int)mtmp->my);
  if ((mtmp->field_0x63 & 1) != 0) {
    m_unleash(mtmp,'\x01');
  }
LAB_00173da8:
  if (((uVar6 >> 0x1a & 1) == 0) && (mtmp->mtame != '\0')) {
    piVar1 = (int *)((long)&mtmp[1].dlevel + 4);
    *piVar1 = *piVar1 + 1;
    pbVar2 = (byte *)((long)&mtmp[1].minvent + 6);
    *pbVar2 = *pbVar2 & 0xfe;
    *(undefined4 *)&mtmp[1].dlevel = 0;
    *(undefined2 *)((long)&mtmp[1].minvent + 4) = 0xffff;
    if (was_dead == '\0') {
      if ((ulong)*(uint *)((long)&mtmp[1].data + 4) < (ulong)moves + 500) {
        *(uint *)((long)&mtmp[1].data + 4) = moves + 500;
      }
    }
    else {
      *(uint *)((long)&mtmp[1].data + 4) = moves + 500;
      *(undefined8 *)&mtmp->field_0x74 = 0x271000000000;
      *(undefined8 *)((long)&mtmp[1].nmon + 4) = 5;
    }
  }
  return;
}

Assistant:

void wary_dog(struct monst *mtmp, boolean was_dead)
{
    struct edog *edog;
    boolean quietly = was_dead;

    mtmp->meating = 0;
    if (!mtmp->mtame) return;
    edog = !mtmp->isminion ? EDOG(mtmp) : 0;

    /* if monster was starving when it died, undo that now */
    if (edog && edog->mhpmax_penalty) {
	mtmp->mhpmax += edog->mhpmax_penalty;
	mtmp->mhp += edog->mhpmax_penalty;	/* heal it */
	edog->mhpmax_penalty = 0;
    }

    if (edog && (edog->killed_by_u == 1 || edog->abuse > 2)) {
	mtmp->mpeaceful = mtmp->mtame = 0;
	if (edog->abuse >= 0 && edog->abuse < 10)
	    if (!rn2(edog->abuse + 1)) mtmp->mpeaceful = 1;
	if (!quietly && cansee(mtmp->mx, mtmp->my)) {
	    if (haseyes(youmonst.data)) {
		if (haseyes(mtmp->data))
			pline("%s %s to look you in the %s.",
				Monnam(mtmp),
				mtmp->mpeaceful ? "seems unable" :
					    "refuses",
				body_part(EYE));
		else 
			pline("%s avoids your gaze.",
				Monnam(mtmp));
	    }
	}
    } else {
	/* chance it goes wild anyway - Pet Semetary */
	if (!rn2(mtmp->mtame)) {
	    mtmp->mpeaceful = mtmp->mtame = 0;
	}
    }
    if (!mtmp->mtame) {
	newsym(mtmp->mx, mtmp->my);
	/* a life-saved monster might be leashed;
	   don't leave it that way if it's no longer tame */
	if (mtmp->mleashed) m_unleash(mtmp, TRUE);
    }

    /* if its still a pet, start a clean pet-slate now */
    if (edog && mtmp->mtame) {
	edog->revivals++;
	edog->killed_by_u = 0;
	edog->abuse = 0;
	edog->ogoal.x = edog->ogoal.y = -1;
	if (was_dead || edog->hungrytime < moves + 500L)
	    edog->hungrytime = moves + 500L;
	if (was_dead) {
	    edog->droptime = 0L;
	    edog->dropdist = 10000;
	    edog->whistletime = 0L;
	    edog->apport = 5;
	} /* else lifesaved, so retain current values */
    }
}